

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O2

Task * AI::create_Wander(void)

{
  Task *in_RDI;
  int in_R8D;
  undefined8 in_XMM1_Qa;
  float in_XMM2_Da;
  Vector3 debugSphereColour;
  string local_e30;
  string local_e10;
  Task selectDestination;
  Task wait;
  Task stopMoving;
  Task moveToDestination;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e10,"wander",(allocator<char> *)&selectDestination);
  Task::Task(in_RDI,&local_e10,Compound);
  std::__cxx11::string::~string((string *)&local_e10);
  Task::Task(&selectDestination);
  selectDestination.action = SelectDestination;
  moveToDestination.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  std::vector<float,_std::allocator<float>_>::emplace_back<float>
            (&selectDestination.parameters.values,(float *)&moveToDestination);
  debugSphereColour.z = in_XMM2_Da;
  debugSphereColour.x = (float)(int)in_XMM1_Qa;
  debugSphereColour.y = (float)(int)((ulong)in_XMM1_Qa >> 0x20);
  create_MoveToDestination(&moveToDestination,(AI *)0x1,70.0,debugSphereColour,1.0,true,true,in_R8D)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e30,"stopMoving",(allocator<char> *)&wait);
  Task::Task(&stopMoving,&local_e30,Simple);
  std::__cxx11::string::~string((string *)&local_e30);
  stopMoving.action = StopMoving;
  create_Wait(&wait,5.0);
  Task::addSubtask(in_RDI,&selectDestination);
  Task::addSubtask(in_RDI,&moveToDestination);
  Task::addSubtask(in_RDI,&stopMoving);
  Task::addSubtask(in_RDI,&wait);
  Task::~Task(&wait);
  Task::~Task(&stopMoving);
  Task::~Task(&moveToDestination);
  Task::~Task(&selectDestination);
  return in_RDI;
}

Assistant:

Task create_Wander()
	{
		Task wander {"wander", TaskType::Compound};
		Task selectDestination;
		selectDestination.action = Action::SelectDestination;
		selectDestination.parameters.values.push_back(static_cast<float>(DestinationType::RandomLocation));
		
		auto moveToDestination = create_MoveToDestination(70.f, {0.0f, 0.8f, 0.1f});		

		Task stopMoving {"stopMoving"};
		stopMoving.action = Action::StopMoving;

		auto wait = create_Wait(5.f);

		wander.addSubtask(selectDestination);
		wander.addSubtask(moveToDestination);
		wander.addSubtask(stopMoving);
		wander.addSubtask(wait);

		return wander;
	}